

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O2

Point2f __thiscall
pbrt::CylindricalMapping2D::Map
          (CylindricalMapping2D *this,TextureEvalContext ctx,Vector2f *dstdx,Vector2f *dstdy)

{
  Tuple2<pbrt::Vector2,_float> TVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  Tuple2<pbrt::Point2,_float> TVar9;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar16 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  Vector3<float> VVar17;
  Point3<float> PVar18;
  Tuple3<pbrt::Vector3,_float> local_40;
  Tuple3<pbrt::Point3,_float> local_30;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  TVar9 = (Tuple2<pbrt::Point2,_float>)cylinder(this,&ctx.p);
  auVar16 = (undefined1  [56])0x0;
  VVar17 = Tuple3<pbrt::Vector3,float>::operator*((Tuple3<pbrt::Vector3,float> *)&ctx.dpdx,0.01);
  local_40.z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar16;
  local_40._0_8_ = vmovlps_avx(auVar10._0_16_);
  PVar18 = Point3<float>::operator+(&ctx.p,(Vector3<float> *)&local_40);
  local_30.z = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  auVar11._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar11._8_56_ = auVar16;
  local_30._0_8_ = vmovlps_avx(auVar11._0_16_);
  auVar12._0_8_ = cylinder(this,(Point3f *)&local_30);
  auVar12._8_56_ = extraout_var;
  auVar7._8_8_ = extraout_XMM0_Qb;
  auVar7._0_4_ = TVar9.x;
  auVar7._4_4_ = TVar9.y;
  auVar7 = vsubps_avx(auVar12._0_16_,auVar7);
  auVar2._8_4_ = 0x3c23d70a;
  auVar2._0_8_ = 0x3c23d70a3c23d70a;
  auVar2._12_4_ = 0x3c23d70a;
  auVar7 = vdivps_avx512vl(auVar7,auVar2);
  TVar1 = (Tuple2<pbrt::Vector2,_float>)vmovlps_avx(auVar7);
  dstdx->super_Tuple2<pbrt::Vector2,_float> = TVar1;
  auVar7 = vmovshdup_avx(auVar7);
  fVar8 = auVar7._0_4_;
  if (fVar8 <= 0.5) {
    if (-0.5 <= fVar8) goto LAB_002d6e4a;
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(ZEXT416((uint)(fVar8 + 1.0)),auVar5);
    fVar8 = auVar7._0_4_;
  }
  else {
    fVar8 = 1.0 - fVar8;
  }
  (dstdx->super_Tuple2<pbrt::Vector2,_float>).y = fVar8;
LAB_002d6e4a:
  auVar16 = (undefined1  [56])0x0;
  VVar17 = Tuple3<pbrt::Vector3,float>::operator*((Tuple3<pbrt::Vector3,float> *)&ctx.dpdy,0.01);
  local_40.z = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar16;
  local_40._0_8_ = vmovlps_avx(auVar13._0_16_);
  PVar18 = Point3<float>::operator+(&ctx.p,(Vector3<float> *)&local_40);
  local_30.z = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  auVar14._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar14._8_56_ = auVar16;
  local_30._0_8_ = vmovlps_avx(auVar14._0_16_);
  auVar15._0_8_ = cylinder(this,(Point3f *)&local_30);
  auVar15._8_56_ = extraout_var_00;
  auVar6._8_8_ = extraout_XMM0_Qb;
  auVar6._0_4_ = TVar9.x;
  auVar6._4_4_ = TVar9.y;
  auVar7 = vsubps_avx(auVar15._0_16_,auVar6);
  auVar3._8_4_ = 0x3c23d70a;
  auVar3._0_8_ = 0x3c23d70a3c23d70a;
  auVar3._12_4_ = 0x3c23d70a;
  auVar7 = vdivps_avx512vl(auVar7,auVar3);
  TVar1 = (Tuple2<pbrt::Vector2,_float>)vmovlps_avx(auVar7);
  dstdy->super_Tuple2<pbrt::Vector2,_float> = TVar1;
  auVar7 = vmovshdup_avx(auVar7);
  fVar8 = auVar7._0_4_;
  if (fVar8 <= 0.5) {
    if (-0.5 <= fVar8) {
      return (Point2f)TVar9;
    }
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar7 = vxorps_avx512vl(ZEXT416((uint)(fVar8 + 1.0)),auVar4);
    fVar8 = auVar7._0_4_;
  }
  else {
    fVar8 = 1.0 - fVar8;
  }
  (dstdy->super_Tuple2<pbrt::Vector2,_float>).y = fVar8;
  return (Point2f)TVar9;
}

Assistant:

PBRT_CPU_GPU
    Point2f Map(TextureEvalContext ctx, Vector2f *dstdx, Vector2f *dstdy) const {
        Point2f st = cylinder(ctx.p);
        // Compute texture coordinate differentials for cylinder $(u,v)$ mapping
        const Float delta = .01f;
        Point2f stDeltaX = cylinder(ctx.p + delta * ctx.dpdx);
        *dstdx = (stDeltaX - st) / delta;
        if ((*dstdx)[1] > .5)
            (*dstdx)[1] = 1.f - (*dstdx)[1];
        else if ((*dstdx)[1] < -.5f)
            (*dstdx)[1] = -((*dstdx)[1] + 1);
        Point2f stDeltaY = cylinder(ctx.p + delta * ctx.dpdy);
        *dstdy = (stDeltaY - st) / delta;
        if ((*dstdy)[1] > .5)
            (*dstdy)[1] = 1.f - (*dstdy)[1];
        else if ((*dstdy)[1] < -.5f)
            (*dstdy)[1] = -((*dstdy)[1] + 1);

        return st;
    }